

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.hpp
# Opt level: O2

void __thiscall nite::Console::Result::Result(Result *this)

{
  Color *this_00;
  Color local_28;
  
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  this_00 = &this->color;
  Color::Color(this_00);
  std::__cxx11::string::assign((char *)this);
  Color::Color(&local_28,1.0,1.0,1.0,1.0);
  this_00->r = local_28.r;
  this_00->g = local_28.g;
  (this->color).b = local_28.b;
  (this->color).a = local_28.a;
  this->val = 0;
  return;
}

Assistant:

Result(){
                    msg = "";
                    color = nite::Color(1.0f, 1.0f, 1.0f, 1.0f);
                    val = 0;
                }